

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::reftype<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  undefined8 this;
  bool bVar1;
  Ok *u;
  allocator<char> local_e9;
  string local_e8;
  Err local_c8;
  uint local_a4;
  Err local_a0;
  Err *local_80;
  Err *err;
  MaybeResult<wasm::Ok> _val;
  undefined1 local_40 [8];
  MaybeResult<wasm::Ok> t;
  ParseDeclsCtx *ctx_local;
  
  t.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ = ctx;
  maybeReftype<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_40,ctx);
  bVar1 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)local_40);
  if (bVar1) {
    MaybeResult<wasm::Ok>::MaybeResult
              ((MaybeResult<wasm::Ok> *)&err,(MaybeResult<wasm::Ok> *)local_40);
    local_80 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err);
    bVar1 = local_80 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_a0,local_80);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a0);
      wasm::Err::~Err(&local_a0);
    }
    local_a4 = (uint)bVar1;
    MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err);
    if (local_a4 == 0) {
      u = MaybeResult<wasm::Ok>::operator*((MaybeResult<wasm::Ok> *)local_40);
      Result<wasm::Ok>::Result<wasm::Ok&>(__return_storage_ptr__,u);
      local_a4 = 1;
    }
  }
  else {
    local_a4 = 0;
  }
  MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)local_40);
  this = t.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_;
  if (local_a4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"expected reftype",&local_e9);
    Lexer::err(&local_c8,(Lexer *)this,&local_e8);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_c8);
    wasm::Err::~Err(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeT> reftype(Ctx& ctx) {
  if (auto t = maybeReftype(ctx)) {
    CHECK_ERR(t);
    return *t;
  }
  return ctx.in.err("expected reftype");
}